

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck> __thiscall
slang::ast::getConditionAndCheck(ast *this,CaseStatementSyntax *syntax)

{
  TokenKind TVar1;
  uint uVar2;
  logic_error *plVar3;
  uint uVar4;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar2 = *(int *)&syntax->caseKeyword - 0x74;
  if (2 < (ushort)uVar2) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x3f0);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(plVar3,(string *)&local_38);
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  TVar1 = (syntax->uniqueOrPriority).kind;
  uVar4 = (uint)TVar1;
  if (TVar1 != Unknown) {
    if (TVar1 == PriorityKeyword) {
      uVar4 = 3;
    }
    else if (TVar1 == Unique0Keyword) {
      uVar4 = 2;
    }
    else {
      if (TVar1 != UniqueKeyword) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,&local_d9);
        std::operator+(&local_98,&local_b8,":");
        std::__cxx11::to_string(&local_d8,0x402);
        std::operator+(&local_78,&local_98,&local_d8);
        std::operator+(&local_58,&local_78,": ");
        std::operator+(&local_38,&local_58,"Default case should be unreachable!");
        std::logic_error::logic_error(plVar3,(string *)&local_38);
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar4 = 1;
    }
  }
  *(uint *)this = uVar4;
  *(uint *)(this + 4) = uVar2 & 0xffff;
  return (tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)
         (_Tuple_impl<0UL,_slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)this;
}

Assistant:

static std::tuple<CaseStatementCondition, CaseStatementCheck> getConditionAndCheck(
    const CaseStatementSyntax& syntax) {

    CaseStatementCondition condition;
    switch (syntax.caseKeyword.kind) {
        case TokenKind::CaseKeyword:
            condition = CaseStatementCondition::Normal;
            break;
        case TokenKind::CaseXKeyword:
            condition = CaseStatementCondition::WildcardXOrZ;
            break;
        case TokenKind::CaseZKeyword:
            condition = CaseStatementCondition::WildcardJustZ;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    CaseStatementCheck check;
    switch (syntax.uniqueOrPriority.kind) {
        case TokenKind::Unknown:
            check = CaseStatementCheck::None;
            break;
        case TokenKind::UniqueKeyword:
            check = CaseStatementCheck::Unique;
            break;
        case TokenKind::Unique0Keyword:
            check = CaseStatementCheck::Unique0;
            break;
        case TokenKind::PriorityKeyword:
            check = CaseStatementCheck::Priority;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    return {condition, check};
}